

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

void log_secret(ptls_t *tls,char *type,ptls_iovec_t secret)

{
  code *pcVar1;
  undefined8 uVar2;
  char *pcVar3;
  size_t in_RCX;
  void *in_RDX;
  undefined8 in_RSI;
  long *in_RDI;
  char hexbuf [129];
  char local_a8 [168];
  
  if (*(long *)(*in_RDI + 0x88) != 0) {
    pcVar1 = (code *)**(undefined8 **)(*in_RDI + 0x88);
    uVar2 = *(undefined8 *)(*in_RDI + 0x88);
    pcVar3 = ptls_hexdump(local_a8,in_RDX,in_RCX);
    (*pcVar1)(uVar2,in_RDI,in_RSI,"%s",pcVar3);
  }
  return;
}

Assistant:

static void log_secret(ptls_t *tls, const char *type, ptls_iovec_t secret)
{
    char hexbuf[PTLS_MAX_DIGEST_SIZE * 2 + 1];

    PTLS_PROBE(NEW_SECRET, tls, type, ptls_hexdump(hexbuf, secret.base, secret.len));

    if (tls->ctx->log_event != NULL)
        tls->ctx->log_event->cb(tls->ctx->log_event, tls, type, "%s", ptls_hexdump(hexbuf, secret.base, secret.len));
}